

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O2

int __thiscall gflags::anon_unknown_2::DisplayInfoGroup::SizeInLines(DisplayInfoGroup *this)

{
  return (((int)(this->group->_M_t)._M_impl.super__Rb_tree_header._M_node_count -
          (uint)(*this->header == '\0')) - (uint)(*this->footer == '\0')) + 3;
}

Assistant:

int SizeInLines() const {
    int size_in_lines = static_cast<int>(group->size()) + 1;
    if (strlen(header) > 0) {
      size_in_lines++;
    }
    if (strlen(footer) > 0) {
      size_in_lines++;
    }
    return size_in_lines;
  }